

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.h
# Opt level: O2

RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> * __thiscall
data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::add
          (RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this,int *key)

{
  int iVar1;
  int iVar2;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar3;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar4;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *node;
  WeightedGraphAdjSet<int,_int> WStack_98;
  TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_> local_60;
  
  pRVar3 = this->_root;
  if (pRVar3 == (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                 *)0x0) {
    pRVar3 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)operator_new(0x70);
    WeightedGraphAdjSet<int,_int>::WeightedGraphAdjSet(&WStack_98);
    TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::TreeElement
              (&local_60,key,&WStack_98);
    RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
    ::RBTreeNode(pRVar3,&local_60);
    this->_root = pRVar3;
    WeightedGraphAdjSet<int,_int>::~WeightedGraphAdjSet(&local_60.value);
    WeightedGraphAdjSet<int,_int>::~WeightedGraphAdjSet(&WStack_98);
  }
  else {
    node = pRVar3->_parent;
    while (pRVar4 = pRVar3,
          pRVar4 != (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                     *)0x0) {
      iVar1 = (pRVar4->element).key;
      if (iVar1 == *key) {
        return this;
      }
      node = pRVar4;
      pRVar3 = (&pRVar4->_left)[iVar1 <= *key];
    }
    pRVar3 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)operator_new(0x70);
    WeightedGraphAdjSet<int,_int>::WeightedGraphAdjSet(&WStack_98);
    TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::TreeElement
              (&local_60,key,&WStack_98);
    RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
    ::RBTreeNode(pRVar3,&local_60);
    WeightedGraphAdjSet<int,_int>::~WeightedGraphAdjSet(&local_60.value);
    WeightedGraphAdjSet<int,_int>::~WeightedGraphAdjSet(&WStack_98);
    iVar2 = *key;
    iVar1 = (node->element).key;
    (&node->_left)[iVar1 <= iVar2] = pRVar3;
    pRVar3->_parent = node;
    pRVar3->_is_left = iVar2 < iVar1;
    pRVar3->_is_red = true;
    while (node != (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                    *)0x0) {
      node->node_count = node->node_count + 1;
      pRVar3 = _balance(this,node);
      node = pRVar3->_parent;
    }
    if (this->_root->_is_red == true) {
      this->_root->_is_red = false;
    }
  }
  return this;
}

Assistant:

inline
    RBTree<Key, Value>& RBTree<Key, Value>::add(const Key &key){
        if (isEmpty()) {
            _root = new RBTreeNode<TreeElement<Key, Value>>(TreeElement<Key, Value>(key, Value()));
            return *this;
        }
        auto node = _root;
        auto parent = _root->parent();
        while (node != nullptr) {
            if (node->element.key == key) {
                return *this;
            }
            parent = node;
            if (key < node->element.key) {
                node = node->left();
            } else {
                node = node->right();
            }
        }
        node = new RBTreeNode<TreeElement<Key, Value>>(TreeElement<Key, Value>(key, Value()));
        if (key < parent->element.key) {
            parent->insertLeft(node, true);
        } else {
            parent->insertRight(node, true);
        }
        while (parent != nullptr) {
            parent->node_count++;
            parent = _balance(parent)->parent();
        }
        // reset the root's color
        if (_root->isRed()) {
            _root->flipColors();
        }
        return *this;
    }